

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

bool __thiscall
embree::SceneGraph::TransformNode::calculateClosed(TransformNode *this,bool group_instancing)

{
  Node *pNVar1;
  byte bVar2;
  int iVar3;
  
  bVar2 = 1;
  if ((this->super_Node).closed == false) {
    (this->super_Node).closed = group_instancing;
    pNVar1 = (this->child).ptr;
    iVar3 = (*(pNVar1->super_RefCount)._vptr_RefCount[7])(pNVar1,(ulong)group_instancing);
    bVar2 = (byte)iVar3 & (this->super_Node).closed;
    (this->super_Node).closed = (bool)bVar2;
    (this->super_Node).hasLightOrCamera = ((this->child).ptr)->hasLightOrCamera;
  }
  return (bool)((this->super_Node).indegree == 1 & bVar2);
}

Assistant:

bool SceneGraph::TransformNode::calculateClosed(bool group_instancing) 
  {
    assert(indegree);
    if (!closed) {
      closed = group_instancing;
      closed &= child->calculateClosed(group_instancing);
      hasLightOrCamera = child->hasLightOrCamera;
    }
    return closed && (indegree == 1);
  }